

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ctr_drbg.c
# Opt level: O3

int block_cipher_df(uchar *output,uchar *data,size_t data_len)

{
  int iVar1;
  long lVar2;
  ulong uVar3;
  uint uVar4;
  ulong uVar5;
  uchar *puVar6;
  uint *puVar7;
  bool bVar8;
  uchar chain [16];
  uchar tmp [48];
  uchar key [32];
  mbedtls_aes_context aes_ctx;
  uchar buf [416];
  undefined8 local_368;
  undefined8 uStack_360;
  ulong local_350;
  uchar local_348 [8];
  undefined8 auStack_340 [3];
  undefined8 local_328;
  undefined8 uStack_320;
  uchar local_318 [32];
  mbedtls_aes_context local_2f8;
  undefined4 local_1d8;
  uint auStack_1d4 [3];
  undefined2 local_1c8;
  undefined1 local_1c6;
  undefined1 local_1c5;
  undefined1 local_1c1;
  undefined1 local_1c0 [400];
  
  iVar1 = -0x38;
  if (data_len < 0x181) {
    memset(&local_1d8,0,0x1a0);
    mbedtls_aes_init(&local_2f8);
    local_1c8 = 0;
    local_1c6 = (undefined1)(data_len >> 8);
    local_1c5 = (undefined1)data_len;
    local_1c1 = 0x30;
    memcpy(local_1c0,data,data_len);
    local_1c0[data_len] = 0x80;
    local_318[0] = '\0';
    local_318[1] = '\x01';
    local_318[2] = '\x02';
    local_318[3] = '\x03';
    local_318[4] = '\x04';
    local_318[5] = '\x05';
    local_318[6] = '\x06';
    local_318[7] = '\a';
    local_318[8] = '\b';
    local_318[9] = '\t';
    local_318[10] = '\n';
    local_318[0xb] = '\v';
    local_318[0xc] = '\f';
    local_318[0xd] = '\r';
    local_318[0xe] = '\x0e';
    local_318[0xf] = '\x0f';
    local_318[0x10] = '\x10';
    local_318[0x11] = '\x11';
    local_318[0x12] = '\x12';
    local_318[0x13] = '\x13';
    local_318[0x14] = '\x14';
    local_318[0x15] = '\x15';
    local_318[0x16] = '\x16';
    local_318[0x17] = '\x17';
    local_318[0x18] = '\x18';
    local_318[0x19] = '\x19';
    local_318[0x1a] = '\x1a';
    local_318[0x1b] = '\x1b';
    local_318[0x1c] = '\x1c';
    local_318[0x1d] = '\x1d';
    local_318[0x1e] = '\x1e';
    local_318[0x1f] = '\x1f';
    iVar1 = mbedtls_aes_setkey_enc(&local_2f8,local_318,0x100);
    if (iVar1 == 0) {
      local_350 = data_len + 0x19;
      uVar3 = 0;
      do {
        local_368 = 0;
        uStack_360 = 0;
        puVar7 = &local_1d8;
        uVar5 = local_350;
        while (uVar5 != 0) {
          local_368 = CONCAT44(puVar7[1] ^ local_368._4_4_,*puVar7 ^ (uint)local_368);
          uStack_360 = CONCAT44(puVar7[3] ^ uStack_360._4_4_,puVar7[2] ^ (uint)uStack_360);
          puVar7 = puVar7 + 4;
          bVar8 = uVar5 < 0x10;
          uVar5 = uVar5 - 0x10;
          if (bVar8) {
            uVar5 = 0;
          }
          iVar1 = mbedtls_aes_crypt_ecb(&local_2f8,1,(uchar *)&local_368,(uchar *)&local_368);
          if (iVar1 != 0) goto LAB_00107edb;
        }
        local_1d8._3_1_ = local_1d8._3_1_ + '\x01';
        *(undefined8 *)((long)auStack_340 + (uVar3 - 8)) = local_368;
        *(undefined8 *)((long)auStack_340 + uVar3) = uStack_360;
        bVar8 = uVar3 < 0x20;
        uVar3 = uVar3 + 0x10;
      } while (bVar8);
      iVar1 = mbedtls_aes_setkey_enc(&local_2f8,local_348,0x100);
      if (iVar1 == 0) {
        uVar4 = 0xfffffff0;
        puVar6 = output;
        do {
          iVar1 = mbedtls_aes_crypt_ecb(&local_2f8,1,(uchar *)&local_328,(uchar *)&local_328);
          if (iVar1 != 0) break;
          *(undefined8 *)puVar6 = local_328;
          *(undefined8 *)(puVar6 + 8) = uStack_320;
          puVar6 = puVar6 + 0x10;
          uVar4 = uVar4 + 0x10;
          iVar1 = 0;
        } while (uVar4 < 0x20);
      }
    }
LAB_00107edb:
    mbedtls_aes_free(&local_2f8);
    lVar2 = 0;
    do {
      *(undefined1 *)((long)auStack_1d4 + lVar2 + -4) = 0;
      lVar2 = lVar2 + 1;
    } while (lVar2 != 0x1a0);
    lVar2 = 0;
    do {
      *(undefined1 *)((long)auStack_340 + lVar2 + -8) = 0;
      lVar2 = lVar2 + 1;
    } while (lVar2 != 0x30);
    lVar2 = 0;
    do {
      local_318[lVar2] = '\0';
      lVar2 = lVar2 + 1;
    } while (lVar2 != 0x20);
    lVar2 = 0;
    do {
      *(undefined1 *)((long)&local_368 + lVar2) = 0;
      lVar2 = lVar2 + 1;
    } while (lVar2 != 0x10);
    if (iVar1 == 0) {
      iVar1 = 0;
    }
    else {
      lVar2 = 0;
      do {
        output[lVar2] = '\0';
        lVar2 = lVar2 + 1;
      } while (lVar2 != 0x30);
    }
  }
  return iVar1;
}

Assistant:

static int block_cipher_df( unsigned char *output,
                            const unsigned char *data, size_t data_len )
{
    unsigned char buf[MBEDTLS_CTR_DRBG_MAX_SEED_INPUT + MBEDTLS_CTR_DRBG_BLOCKSIZE + 16];
    unsigned char tmp[MBEDTLS_CTR_DRBG_SEEDLEN];
    unsigned char key[MBEDTLS_CTR_DRBG_KEYSIZE];
    unsigned char chain[MBEDTLS_CTR_DRBG_BLOCKSIZE];
    unsigned char *p, *iv;
    mbedtls_aes_context aes_ctx;
    int ret = 0;

    int i, j;
    size_t buf_len, use_len;

    if( data_len > MBEDTLS_CTR_DRBG_MAX_SEED_INPUT )
        return( MBEDTLS_ERR_CTR_DRBG_INPUT_TOO_BIG );

    memset( buf, 0, MBEDTLS_CTR_DRBG_MAX_SEED_INPUT + MBEDTLS_CTR_DRBG_BLOCKSIZE + 16 );
    mbedtls_aes_init( &aes_ctx );

    /*
     * Construct IV (16 bytes) and S in buffer
     * IV = Counter (in 32-bits) padded to 16 with zeroes
     * S = Length input string (in 32-bits) || Length of output (in 32-bits) ||
     *     data || 0x80
     *     (Total is padded to a multiple of 16-bytes with zeroes)
     */
    p = buf + MBEDTLS_CTR_DRBG_BLOCKSIZE;
    *p++ = ( data_len >> 24 ) & 0xff;
    *p++ = ( data_len >> 16 ) & 0xff;
    *p++ = ( data_len >> 8  ) & 0xff;
    *p++ = ( data_len       ) & 0xff;
    p += 3;
    *p++ = MBEDTLS_CTR_DRBG_SEEDLEN;
    memcpy( p, data, data_len );
    p[data_len] = 0x80;

    buf_len = MBEDTLS_CTR_DRBG_BLOCKSIZE + 8 + data_len + 1;

    for( i = 0; i < MBEDTLS_CTR_DRBG_KEYSIZE; i++ )
        key[i] = i;

    if( ( ret = mbedtls_aes_setkey_enc( &aes_ctx, key, MBEDTLS_CTR_DRBG_KEYBITS ) ) != 0 )
    {
        goto exit;
    }

    /*
     * Reduce data to MBEDTLS_CTR_DRBG_SEEDLEN bytes of data
     */
    for( j = 0; j < MBEDTLS_CTR_DRBG_SEEDLEN; j += MBEDTLS_CTR_DRBG_BLOCKSIZE )
    {
        p = buf;
        memset( chain, 0, MBEDTLS_CTR_DRBG_BLOCKSIZE );
        use_len = buf_len;

        while( use_len > 0 )
        {
            for( i = 0; i < MBEDTLS_CTR_DRBG_BLOCKSIZE; i++ )
                chain[i] ^= p[i];
            p += MBEDTLS_CTR_DRBG_BLOCKSIZE;
            use_len -= ( use_len >= MBEDTLS_CTR_DRBG_BLOCKSIZE ) ?
                       MBEDTLS_CTR_DRBG_BLOCKSIZE : use_len;

            if( ( ret = mbedtls_aes_crypt_ecb( &aes_ctx, MBEDTLS_AES_ENCRYPT, chain, chain ) ) != 0 )
            {
                goto exit;
            }
        }

        memcpy( tmp + j, chain, MBEDTLS_CTR_DRBG_BLOCKSIZE );

        /*
         * Update IV
         */
        buf[3]++;
    }

    /*
     * Do final encryption with reduced data
     */
    if( ( ret = mbedtls_aes_setkey_enc( &aes_ctx, tmp, MBEDTLS_CTR_DRBG_KEYBITS ) ) != 0 )
    {
        goto exit;
    }
    iv = tmp + MBEDTLS_CTR_DRBG_KEYSIZE;
    p = output;

    for( j = 0; j < MBEDTLS_CTR_DRBG_SEEDLEN; j += MBEDTLS_CTR_DRBG_BLOCKSIZE )
    {
        if( ( ret = mbedtls_aes_crypt_ecb( &aes_ctx, MBEDTLS_AES_ENCRYPT, iv, iv ) ) != 0 )
        {
            goto exit;
        }
        memcpy( p, iv, MBEDTLS_CTR_DRBG_BLOCKSIZE );
        p += MBEDTLS_CTR_DRBG_BLOCKSIZE;
    }
exit:
    mbedtls_aes_free( &aes_ctx );
    /*
    * tidy up the stack
    */
    mbedtls_zeroize( buf, sizeof( buf ) );
    mbedtls_zeroize( tmp, sizeof( tmp ) );
    mbedtls_zeroize( key, sizeof( key ) );
    mbedtls_zeroize( chain, sizeof( chain ) );
    if( 0 != ret )
    {
        /*
        * wipe partial seed from memory
        */
        mbedtls_zeroize( output, MBEDTLS_CTR_DRBG_SEEDLEN );
    }

    return( ret );
}